

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

void __thiscall
Assimp::IFC::anon_unknown_9::Line::SampleDiscrete(Line *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  bool bVar1;
  _func_int **pp_Var2;
  aiVector3t<double> local_30;
  
  bVar1 = Curve::InRange(&this->super_Curve,a);
  if (!bVar1) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xb4,
                  "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar1 = Curve::InRange(&this->super_Curve,b);
  if (bVar1) {
    if ((a != b) || (NAN(a) || NAN(b))) {
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&out->mVerts,
                 ((long)(out->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(out->mVerts).
                       super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18 + 2);
      (*(this->super_Curve)._vptr_Curve[3])(a,&local_30,this);
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      emplace_back<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,&local_30);
      pp_Var2 = (this->super_Curve)._vptr_Curve;
      a = b;
    }
    else {
      pp_Var2 = (this->super_Curve)._vptr_Curve;
    }
    (*pp_Var2[3])(a,&local_30,this);
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    emplace_back<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,&local_30);
    return;
  }
  __assert_fail("InRange( b )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0xb5,
                "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
               );
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        if (a == b) {
            out.mVerts.push_back(Eval(a));
            return;
        }
        out.mVerts.reserve(out.mVerts.size()+2);
        out.mVerts.push_back(Eval(a));
        out.mVerts.push_back(Eval(b));
    }